

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_lsd.cpp
# Opt level: O1

void msd_lsd<12u>(Cacheblock<12U> *cache,size_t N,size_t depth)

{
  undefined8 *puVar1;
  int iVar2;
  undefined8 uVar3;
  size_t i;
  uchar *puVar4;
  void *__src;
  long lVar5;
  Cacheblock<12U> *pCVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  uchar *puVar10;
  ulong uVar11;
  ulong uVar12;
  size_t N_00;
  byte bVar13;
  byte bVar14;
  Cacheblock<12U> *pCVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  long local_1038 [256];
  long local_838 [257];
  
  lVar16 = depth + 1;
  while (0x1f < N) {
    fill_cache<12u>(cache,N,depth);
    puVar10 = (cache->chars)._M_elems + 0xb;
    lVar17 = 0xb;
    do {
      memset(local_1038 + 0x100,0,0x800);
      puVar4 = puVar10;
      uVar8 = N;
      do {
        local_1038[(ulong)*puVar4 + 0x100] = local_1038[(ulong)*puVar4 + 0x100] + 1;
        puVar4 = puVar4 + 0x18;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
      __src = malloc(N * 0x18);
      local_1038[0] = 0;
      lVar5 = 1;
      lVar9 = 0;
      do {
        lVar9 = lVar9 + local_1038[lVar5 + 0xff];
        local_1038[lVar5] = lVar9;
        lVar5 = lVar5 + 1;
        pCVar6 = cache;
        uVar8 = N;
      } while (lVar5 != 0x100);
      do {
        bVar13 = (pCVar6->chars)._M_elems[lVar17];
        lVar5 = local_1038[bVar13];
        local_1038[bVar13] = lVar5 + 1;
        *(uchar **)((long)__src + lVar5 * 0x18 + 0x10) = pCVar6->ptr;
        uVar3 = *(undefined8 *)((pCVar6->chars)._M_elems + 8);
        puVar1 = (undefined8 *)((long)__src + lVar5 * 0x18);
        *puVar1 = *(undefined8 *)(pCVar6->chars)._M_elems;
        puVar1[1] = uVar3;
        uVar8 = uVar8 - 1;
        pCVar6 = pCVar6 + 1;
      } while (uVar8 != 0);
      memcpy(cache,__src,N * 0x18);
      free(__src);
      puVar10 = puVar10 + -1;
      bVar18 = lVar17 != 0;
      lVar17 = lVar17 + -1;
    } while (bVar18);
    if (N == 1) {
      uVar12 = 1;
      uVar8 = 0;
    }
    else {
      uVar11 = 1;
      uVar7 = 0;
      N_00 = 1;
      pCVar6 = cache;
      do {
        if (*(int *)((pCVar6->chars)._M_elems + 8) == *(int *)(pCVar6[1].chars._M_elems + 8) &&
            *(long *)(pCVar6->chars)._M_elems == *(long *)pCVar6[1].chars._M_elems) {
          uVar12 = N_00 + 1;
          uVar8 = uVar7;
        }
        else {
          uVar12 = 1;
          uVar8 = uVar11;
          if ((1 < N_00) && (cache[uVar7].chars._M_elems[0xb] != '\0')) {
            msd_lsd<12u>(cache + uVar7,N_00,depth + 0xc);
          }
        }
        uVar11 = uVar11 + 1;
        pCVar6 = pCVar6 + 1;
        uVar7 = uVar8;
        N_00 = uVar12;
      } while (N != uVar11);
    }
    if (uVar12 < 2) {
      return;
    }
    if (cache[uVar8].chars._M_elems[0xb] == '\0') {
      return;
    }
    cache = cache + uVar8;
    depth = depth + 0xc;
    lVar16 = lVar16 + 0xc;
    N = uVar12;
  }
  pCVar6 = cache;
  if (1 < (long)N) {
    do {
      puVar10 = pCVar6[1].ptr;
      for (pCVar15 = pCVar6 + 1; cache < pCVar15; pCVar15 = pCVar15 + -1) {
        puVar4 = pCVar15[-1].ptr;
        bVar13 = puVar4[depth];
        bVar14 = puVar10[depth];
        if ((bVar13 != 0) && (lVar17 = lVar16, bVar13 == bVar14)) {
          do {
            bVar13 = puVar4[lVar17];
            bVar14 = puVar10[lVar17];
            if (bVar13 == 0) break;
            lVar17 = lVar17 + 1;
          } while (bVar13 == bVar14);
        }
        if (bVar13 <= bVar14) break;
        pCVar15->ptr = puVar4;
      }
      iVar2 = (int)N;
      pCVar15->ptr = puVar10;
      N = (size_t)(iVar2 - 1);
      pCVar6 = pCVar6 + 1;
    } while (2 < iVar2);
  }
  return;
}

Assistant:

static void
msd_lsd(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	static_assert(CachedChars>=1, "CachedChars must be positive");
	if (N < 32) {
		insertion_sort(cache, N, depth);
		return;
	}
	fill_cache(cache, N, depth);
	for (int byte=CachedChars-1; byte >= 0; --byte) {
		size_t bucketsize[256] = {0};
		for (size_t i=0; i < N; ++i)
			++bucketsize[cache[i].chars[byte]];
		Cacheblock<CachedChars>* sorted = (Cacheblock<CachedChars>*)
			malloc(N*sizeof(Cacheblock<CachedChars>));
		size_t bucketindex[256];
		bucketindex[0] = 0;
		for (size_t i=1; i < 256; ++i)
			bucketindex[i] = bucketindex[i-1] + bucketsize[i-1];
		for (size_t i=0; i < N; ++i)
			memcpy(&sorted[bucketindex[cache[i].chars[byte]]++],
					cache+i,
					sizeof(Cacheblock<CachedChars>));
		memcpy(cache, sorted, N*sizeof(Cacheblock<CachedChars>));
		free(sorted);
	}
	size_t start=0, cnt=1;
	for (size_t i=0; i < N-1; ++i) {
		if (memcmp(cache[i].chars.data(), cache[i+1].chars.data(),
				CachedChars) == 0) {
			++cnt;
			continue;
		}
		if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
			msd_lsd(cache+start, cnt, depth+CachedChars);
		}
		cnt = 1;
		start = i+1;
	}
	if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
		msd_lsd(cache+start, cnt, depth+CachedChars);
	}
}